

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O0

void __thiscall Js::EquivalentTypeSet::SortAndRemoveDuplicates(EquivalentTypeSet *this)

{
  JITTypeHolderBase<Memory::Recycler> *pJVar1;
  bool bVar2;
  JITTypeHolderBase<Memory::Recycler> **ppJVar3;
  uint uVar4;
  ulong uVar5;
  bool local_39;
  JITTypeHolderBase<void> local_30;
  ushort local_22;
  uint16 j_1;
  JITTypeHolder tmp;
  uint16 j;
  uint16 i;
  uint16 oldCount;
  EquivalentTypeSet *this_local;
  
  tmp.t._6_2_ = this->count;
  for (tmp.t._4_2_ = 1; tmp.t._4_2_ < tmp.t._6_2_; tmp.t._4_2_ = tmp.t._4_2_ + 1) {
    tmp.t._2_2_ = tmp.t._4_2_;
    while( true ) {
      local_39 = false;
      if (tmp.t._2_2_ != 0) {
        ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&this->types);
        pJVar1 = *ppJVar3;
        uVar4 = (uint)tmp.t._2_2_;
        ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                            ((WriteBarrierPtr *)&this->types);
        local_39 = JITTypeHolderBase<Memory::Recycler>::operator>
                             (pJVar1 + (int)(uVar4 - 1),*ppJVar3 + tmp.t._2_2_);
      }
      if (local_39 == false) break;
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      JITTypeHolderBase<void>::JITTypeHolderBase<Memory::Recycler>
                ((JITTypeHolderBase<void> *)&stack0xffffffffffffffe0,*ppJVar3 + tmp.t._2_2_);
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      pJVar1 = *ppJVar3;
      uVar4 = (uint)tmp.t._2_2_;
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      JITTypeHolderBase<Memory::Recycler>::operator=
                (*ppJVar3 + tmp.t._2_2_,pJVar1 + (int)(uVar4 - 1));
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      JITTypeHolderBase<Memory::Recycler>::operator=
                (*ppJVar3 + (int)(tmp.t._2_2_ - 1),
                 (JITTypeHolderBase<void> *)&stack0xffffffffffffffe0);
      tmp.t._2_2_ = tmp.t._2_2_ - 1;
    }
  }
  tmp.t._4_2_ = 0;
  for (local_22 = 1; local_22 < tmp.t._6_2_; local_22 = local_22 + 1) {
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                        ((WriteBarrierPtr *)&this->types);
    pJVar1 = *ppJVar3;
    uVar5 = (ulong)tmp.t._4_2_;
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                        ((WriteBarrierPtr *)&this->types);
    bVar2 = JITTypeHolderBase<Memory::Recycler>::operator!=(pJVar1 + uVar5,*ppJVar3 + local_22);
    if (bVar2) {
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      pJVar1 = *ppJVar3;
      uVar5 = (ulong)local_22;
      ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                          ((WriteBarrierPtr *)&this->types);
      tmp.t._4_2_ = tmp.t._4_2_ + 1;
      JITTypeHolderBase<Memory::Recycler>::operator=(*ppJVar3 + tmp.t._4_2_,pJVar1 + uVar5);
    }
  }
  tmp.t._4_2_ = tmp.t._4_2_ + 1;
  this->count = tmp.t._4_2_;
  for (; tmp.t._4_2_ < tmp.t._6_2_; tmp.t._4_2_ = tmp.t._4_2_ + 1) {
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_30,(JITType *)0x0);
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JITTypeHolderBase__
                        ((WriteBarrierPtr *)&this->types);
    JITTypeHolderBase<Memory::Recycler>::operator=(*ppJVar3 + tmp.t._4_2_,&local_30);
  }
  this->sortedAndDuplicatesRemoved = true;
  return;
}

Assistant:

void EquivalentTypeSet::SortAndRemoveDuplicates()
{
    uint16 oldCount = this->count;
    uint16 i;

    // sorting
    for (i = 1; i < oldCount; i++)
    {
        uint16 j = i;
        while (j > 0 && (this->types[j - 1] > this->types[j]))
        {
            JITTypeHolder tmp = this->types[j];
            this->types[j] = this->types[j - 1];
            this->types[j - 1] = tmp;
            j--;
        }
    }

    // removing duplicate types from the sorted set
    i = 0;
    for (uint16 j = 1; j < oldCount; j++)
    {
        if (this->types[i] != this->types[j])
        {
            this->types[++i] = this->types[j];
        }
    }
    this->count = ++i;
    for (i; i < oldCount; i++)
    {
        this->types[i] = JITTypeHolder(nullptr);
    }

    this->sortedAndDuplicatesRemoved = true;
}